

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::resolveReference(Value *this,char *key,bool isStatic)

{
  ushort uVar1;
  ValueHolder VVar2;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  int iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  CZString actualKey;
  value_type defaultValue;
  ValueHolder local_68;
  int local_60;
  ValueHolder local_50;
  ushort local_48;
  Value local_40;
  
  if (this->field_0x8 == '\0') {
    Value((Value *)&local_68,objectValue);
    Value((Value *)&local_50,(Value *)&local_68);
    uVar1 = *(ushort *)&this->field_0x8;
    VVar2 = this->value_;
    this->value_ = local_50;
    *(ushort *)&this->field_0x8 = local_48 & 0x1ff | uVar1 & 0xfe00;
    local_48 = uVar1 & 0x1ff | local_48 & 0xfe00;
    local_50 = VVar2;
    ~Value((Value *)&local_50);
    ~Value((Value *)&local_68);
  }
  else if (this->field_0x8 != '\a') {
    __assert_fail("type_ == nullValue || type_ == objectValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x475,"Value &Json::Value::resolveReference(const char *, bool)");
  }
  CZString::CZString((CZString *)&local_68,key,(uint)!isStatic * 2);
  this_00 = &((this->value_).map_)->_M_t;
  iVar4 = std::
          _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::_M_lower_bound(this_00,(_Link_type)
                                   (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent,
                           &(this_00->_M_impl).super__Rb_tree_header._M_header,(CZString *)&local_68
                          );
  if ((_Rb_tree_header *)iVar4._M_node !=
      &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var5 = iVar4._M_node + 1;
    if (*(char **)(iVar4._M_node + 1) == (char *)0x0) {
      if (*(int *)&iVar4._M_node[1]._M_parent == local_60) goto LAB_001437a3;
    }
    else {
      iVar3 = strcmp(*(char **)(iVar4._M_node + 1),local_68.string_);
      if (iVar3 == 0) goto LAB_001437a3;
    }
  }
  CZString::CZString((CZString *)&local_50,(CZString *)&local_68);
  Value(&local_40,(Value *)null);
  iVar4 = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)(this->value_).map_,iVar4._M_node,
                     (pair<const_Json::Value::CZString,_Json::Value> *)&local_50);
  p_Var5 = iVar4._M_node + 1;
  ~Value(&local_40);
  CZString::~CZString((CZString *)&local_50);
LAB_001437a3:
  CZString::~CZString((CZString *)&local_68);
  return (Value *)&p_Var5->_M_left;
}

Assistant:

Value &
Value::resolveReference( const char *key, 
                         bool isStatic )
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == objectValue );
   if ( type_ == nullValue )
      *this = Value( objectValue );
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   CZString actualKey( key, isStatic ? CZString::noDuplication 
                                     : CZString::duplicateOnCopy );
   ObjectValues::iterator it = value_.map_->lower_bound( actualKey );
   if ( it != value_.map_->end()  &&  (*it).first == actualKey )
      return (*it).second;

   ObjectValues::value_type defaultValue( actualKey, null );
   it = value_.map_->insert( it, defaultValue );
   Value &value = (*it).second;
   return value;
#else
   return value_.map_->resolveReference( key, isStatic );
#endif
}